

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

uint32_t helper_neon_qrdmlsh_s16_arm(CPUARMState *env,uint32_t src1,uint32_t src2,uint32_t src3)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint16_t e2;
  uint16_t e1;
  uint32_t src3_local;
  uint32_t src2_local;
  uint32_t src1_local;
  CPUARMState *env_local;
  
  uVar1 = inl_qrdmlsh_s16(env,(int16_t)src1,(int16_t)src2,(int16_t)src3);
  uVar2 = inl_qrdmlsh_s16(env,(int16_t)(src1 >> 0x10),(int16_t)(src2 >> 0x10),
                          (int16_t)(src3 >> 0x10));
  uVar3 = deposit32((uint)uVar1,0x10,0x10,(uint)uVar2);
  return uVar3;
}

Assistant:

uint32_t HELPER(neon_qrdmlsh_s16)(CPUARMState *env, uint32_t src1,
                                  uint32_t src2, uint32_t src3)
{
    uint16_t e1 = inl_qrdmlsh_s16(env, src1, src2, src3);
    uint16_t e2 = inl_qrdmlsh_s16(env, src1 >> 16, src2 >> 16, src3 >> 16);
    return deposit32(e1, 16, 16, e2);
}